

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  ImRect *pIVar2;
  ImGuiTextBuffer *pIVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  ImGuiTabBar *pIVar7;
  ImGuiTabBar *pIVar8;
  int iVar9;
  
  iVar5 = this->FreeIdx;
  iVar9 = (this->Data).Size;
  if (iVar5 == iVar9) {
    iVar1 = iVar9 + 1;
    iVar6 = (this->Data).Capacity;
    if (iVar6 <= iVar9) {
      if (iVar6 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar6 / 2 + iVar6;
      }
      if (iVar9 <= iVar1) {
        iVar9 = iVar1;
      }
      if (iVar6 < iVar9) {
        pIVar8 = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar9 << 7);
        pIVar7 = (this->Data).Data;
        if (pIVar7 != (ImGuiTabBar *)0x0) {
          memcpy(pIVar8,pIVar7,(long)(this->Data).Size << 7);
          ImGui::MemFree((this->Data).Data);
        }
        (this->Data).Data = pIVar8;
        (this->Data).Capacity = iVar9;
      }
    }
    (this->Data).Size = iVar1;
    iVar9 = this->FreeIdx + 1;
  }
  else {
    if (iVar9 <= iVar5) goto LAB_00150330;
    iVar9 = (this->Data).Data[iVar5].Tabs.Size;
  }
  this->FreeIdx = iVar9;
  if (iVar5 < (this->Data).Size) {
    pIVar8 = (this->Data).Data;
    pIVar7 = pIVar8 + iVar5;
    (pIVar7->Tabs).Size = 0;
    (pIVar7->Tabs).Capacity = 0;
    (pIVar7->Tabs).Data = (ImGuiTabItem *)0x0;
    pIVar2 = &pIVar8[iVar5].BarRect;
    (pIVar2->Min).x = 3.4028235e+38;
    (pIVar2->Min).y = 3.4028235e+38;
    (pIVar2->Max).x = -3.4028235e+38;
    (pIVar2->Max).y = -3.4028235e+38;
    pIVar8[iVar5].FramePadding.x = 0.0;
    pIVar8[iVar5].FramePadding.y = 0.0;
    pIVar3 = &pIVar8[iVar5].TabsNames;
    (pIVar3->Buf).Size = 0;
    (pIVar3->Buf).Capacity = 0;
    (pIVar3->Buf).Data = (char *)0x0;
    pIVar7 = pIVar8 + iVar5;
    pIVar7->ID = 0;
    pIVar7->SelectedTabId = 0;
    *(undefined8 *)(&pIVar7->ID + 2) = 0;
    pIVar8[iVar5].CurrFrameVisible = -1;
    pIVar8[iVar5].PrevFrameVisible = -1;
    pIVar7 = pIVar8 + iVar5;
    pIVar7->ContentsHeight = 0.0;
    pIVar7->OffsetMax = 0.0;
    *(undefined8 *)(&pIVar7->ContentsHeight + 2) = 0;
    pIVar7 = pIVar8 + iVar5;
    pIVar7->ScrollingTarget = 0.0;
    pIVar7->ScrollingTargetDistToVisibility = 0.0;
    *(undefined8 *)(&pIVar7->ScrollingTarget + 2) = 0;
    puVar4 = (undefined8 *)((long)&pIVar8[iVar5].ScrollingSpeed + 2);
    *puVar4 = 0;
    puVar4[1] = 0;
    pIVar8[iVar5].LastTabItemIdx = -1;
    if (iVar5 < (this->Data).Size) {
      return (this->Data).Data + iVar5;
    }
  }
LAB_00150330:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                ,0x4d7,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Data.Size) { Data.resize(Data.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Data[idx]; } IM_PLACEMENT_NEW(&Data[idx]) T(); return &Data[idx]; }